

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O1

void Prn_gen<Blob<128>>(int nbRn,pfHash hash,vector<Blob<128>,_std::allocator<Blob<128>_>_> *hashes)

{
  Blob<128> h;
  value_type local_48;
  uint8_t local_38 [16];
  
  printf("Generating %i random numbers : \n",(ulong)(uint)nbRn);
  local_48.bytes = (uint8_t  [16])(ZEXT816(0) << 0x40);
  if (0 < nbRn) {
    local_38 = local_48.bytes;
    do {
      (*hash)(local_38,0x10,0,&local_48);
      std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::push_back(hashes,&local_48);
      local_38[0] = local_48.bytes[0];
      local_38[1] = local_48.bytes[1];
      local_38[2] = local_48.bytes[2];
      local_38[3] = local_48.bytes[3];
      local_38[4] = local_48.bytes[4];
      local_38[5] = local_48.bytes[5];
      local_38[6] = local_48.bytes[6];
      local_38[7] = local_48.bytes[7];
      local_38[8] = local_48.bytes[8];
      local_38[9] = local_48.bytes[9];
      local_38[10] = local_48.bytes[10];
      local_38[0xb] = local_48.bytes[0xb];
      local_38[0xc] = local_48.bytes[0xc];
      local_38[0xd] = local_48.bytes[0xd];
      local_38[0xe] = local_48.bytes[0xe];
      local_38[0xf] = local_48.bytes[0xf];
      local_48.bytes = (uint8_t  [16])(ZEXT816(0) << 0x20);
      nbRn = nbRn + -1;
    } while (nbRn != 0);
  }
  return;
}

Assistant:

void Prn_gen (int nbRn, pfHash hash, std::vector<hashtype> & hashes )
{
  assert(nbRn < 0);

  printf("Generating %i random numbers : \n", nbRn);

  hashtype hcopy;
  memset(&hcopy, 0, sizeof(hcopy));

  // a generated random number becomes the input for the next one
  for (int i=0; i< nbRn; i++) {
      hashtype h;
      hash(&hcopy, sizeof(hcopy), 0, &h);
      hashes.push_back(h);
      memcpy(&hcopy, &h, sizeof(h));
  }
}